

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O0

Opnd * __thiscall IRBuilder::GetEnvironmentOperand(IRBuilder *this,uint32 offset)

{
  code *pcVar1;
  bool bVar2;
  RegSlot reg;
  BOOL BVar3;
  RegSlot RVar4;
  StackSym *pSVar5;
  SymOpnd *src1Opnd;
  undefined4 *puVar6;
  Instr *pIVar7;
  RegOpnd *pRVar8;
  RegOpnd *regOpnd_1;
  SymID symID;
  RegOpnd *regOpnd;
  Opnd *fieldOpnd;
  StackSym *sym;
  uint32 offset_local;
  IRBuilder *this_local;
  
  bVar2 = Func::DoStackFrameDisplay(this->m_func);
  if ((bVar2) && (pSVar5 = Func::GetLocalFrameDisplaySym(this->m_func), pSVar5 != (StackSym *)0x0))
  {
    pSVar5 = Func::GetLocalFrameDisplaySym(this->m_func);
    src1Opnd = BuildFieldOpnd(this,LdSlotArr,(pSVar5->super_Sym).m_id,0,0xffffffff,
                              PropertyKindSlotArray,0xffffffff);
    pRVar8 = IR::RegOpnd::New(TyVar,this->m_func);
    pIVar7 = IR::Instr::New(LdSlotArr,&pRVar8->super_Opnd,&src1Opnd->super_Opnd,this->m_func);
    AddInstr(this,pIVar7,offset);
    fieldOpnd = (Opnd *)pRVar8->m_sym;
  }
  else {
    reg = GetEnvRegForInnerFrameDisplay(this);
    if (reg == 0xffffffff) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                         ,0xf65,"(symID != Js::Constants::NoRegister)",
                         "symID != Js::Constants::NoRegister");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    bVar2 = IsLoopBody(this);
    if ((bVar2) && (BVar3 = RegIsConstant(this,reg), BVar3 == 0)) {
      EnsureLoopBodyLoadSlot(this,reg,false);
    }
    bVar2 = Func::DoStackNestedFunc(this->m_func);
    if ((bVar2) && (RVar4 = GetEnvReg(this), reg == RVar4)) {
      pRVar8 = IR::RegOpnd::New(TyVar,this->m_func);
      pIVar7 = IR::Instr::New(LdEnv,&pRVar8->super_Opnd,this->m_func);
      AddInstr(this,pIVar7,offset);
      fieldOpnd = (Opnd *)pRVar8->m_sym;
    }
    else {
      fieldOpnd = (Opnd *)StackSym::FindOrCreate(reg,reg,this->m_func,TyVar);
    }
  }
  pRVar8 = IR::RegOpnd::New((StackSym *)fieldOpnd,TyVar,this->m_func);
  return &pRVar8->super_Opnd;
}

Assistant:

IR::Opnd*
IRBuilder::GetEnvironmentOperand(uint32 offset)
{
    StackSym* sym = nullptr;
    // The byte code doesn't refer directly to a closure environment. Get the implicit one
    // that's pointed to by the function body.
    if (m_func->DoStackFrameDisplay() && m_func->GetLocalFrameDisplaySym())
    {
        // Read the scope slot pointer back using the stack closure sym.
        IR::Opnd *fieldOpnd = this->BuildFieldOpnd(Js::OpCode::LdSlotArr, m_func->GetLocalFrameDisplaySym()->m_id, 0, (Js::PropertyIdIndexType) - 1, PropertyKindSlotArray);
        IR::RegOpnd *regOpnd = IR::RegOpnd::New(TyVar, m_func);
        this->AddInstr(
            IR::Instr::New(Js::OpCode::LdSlotArr, regOpnd, fieldOpnd, m_func),
            offset);
        sym = regOpnd->m_sym;
    }
    else
    {
        SymID symID;
        symID = this->GetEnvRegForInnerFrameDisplay();
        Assert(symID != Js::Constants::NoRegister);
        if (IsLoopBody() && !RegIsConstant(symID))
        {
            this->EnsureLoopBodyLoadSlot(symID);
        }

        if (m_func->DoStackNestedFunc() && symID == GetEnvReg())
        {
            // Environment is not guaranteed constant during this function because it could become boxed during execution,
            // so load the environment every time you need it.
            IR::RegOpnd *regOpnd = IR::RegOpnd::New(TyVar, m_func);
            this->AddInstr(
                IR::Instr::New(Js::OpCode::LdEnv, regOpnd, m_func),
                offset);
            sym = regOpnd->m_sym;
        }
        else
        {
            sym = StackSym::FindOrCreate(symID, (Js::RegSlot)symID, m_func);
        }
    }

    return IR::RegOpnd::New(sym, TyVar, m_func);
}